

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psquare_suite.cpp
# Opt level: O3

void double_quartile_suite::test_linear_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  close_to<double> predicate_35;
  close_to<double> predicate_36;
  close_to<double> predicate_37;
  close_to<double> predicate_38;
  close_to<double> predicate_39;
  close_to<double> predicate_40;
  close_to<double> predicate_41;
  close_to<double> predicate_42;
  close_to<double> predicate_43;
  close_to<double> predicate_44;
  close_to<double> predicate_45;
  close_to<double> predicate_46;
  close_to<double> predicate_47;
  close_to<double> predicate_48;
  close_to<double> predicate_49;
  close_to<double> predicate_50;
  close_to<double> predicate_51;
  close_to<double> predicate_52;
  close_to<double> predicate_53;
  close_to<double> predicate_54;
  close_to<double> predicate_55;
  close_to<double> predicate_56;
  close_to<double> predicate_57;
  close_to<double> predicate_58;
  close_to<double> predicate_59;
  close_to<double> predicate_60;
  close_to<double> predicate_61;
  close_to<double> predicate_62;
  close_to<double> predicate_63;
  close_to<double> predicate_64;
  close_to<double> predicate_65;
  close_to<double> predicate_66;
  close_to<double> predicate_67;
  close_to<double> predicate_68;
  close_to<double> predicate_69;
  close_to<double> predicate_70;
  close_to<double> predicate_71;
  close_to<double> predicate_72;
  close_to<double> predicate_73;
  close_to<double> predicate_74;
  close_to<double> predicate_75;
  close_to<double> predicate_76;
  close_to<double> predicate_77;
  close_to<double> predicate_78;
  close_to<double> predicate_79;
  close_to<double> predicate_80;
  close_to<double> predicate_81;
  close_to<double> predicate_82;
  close_to<double> predicate_83;
  close_to<double> predicate_84;
  close_to<double> predicate_85;
  close_to<double> predicate_86;
  close_to<double> predicate_87;
  close_to<double> predicate_88;
  close_to<double> predicate_89;
  close_to<double> predicate_90;
  close_to<double> predicate_91;
  close_to<double> predicate_92;
  close_to<double> predicate_93;
  close_to<double> predicate_94;
  close_to<double> predicate_95;
  close_to<double> predicate_96;
  close_to<double> predicate_97;
  close_to<double> predicate_98;
  close_to<double> predicate_99;
  close_to<double> predicate_x00100;
  close_to<double> predicate_x00101;
  close_to<double> predicate_x00102;
  close_to<double> predicate_x00103;
  double local_160;
  psquare_quartile<double> quantile;
  
  quantile.count = 0;
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::initialize
            (&quantile);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,1.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x286,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x287,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_00);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x288,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_01);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x289,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_02);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28a,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_03);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,2.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28d,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_04);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28e,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff4000000000000,predicate_05);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x28f,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff8000000000000,predicate_06);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","1.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x290,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ffc000000000000,predicate_07);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x291,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4000000000000000,predicate_08);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,3.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x294,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_09);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x295,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff8000000000000,predicate_10);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x296,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4000000000000000,predicate_11);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x297,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4004000000000000,predicate_12);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x298,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_13);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,4.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29b,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_14);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","1.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29c,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ffc000000000000,predicate_15);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29d,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4004000000000000,predicate_16);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","3.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29e,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x400a000000000000,predicate_17);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x29f,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4010000000000000,predicate_18);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,5.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a2,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_19);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_20.absolute = 2.2250738585072014e-308;
  predicate_20.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a3,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4000000000000000,predicate_20);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_21.absolute = 2.2250738585072014e-308;
  predicate_21.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a4,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_21);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_22.absolute = 2.2250738585072014e-308;
  predicate_22.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a5,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4010000000000000,predicate_22);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_23.absolute = 2.2250738585072014e-308;
  predicate_23.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a6,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_23);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,6.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_24.absolute = 2.2250738585072014e-308;
  predicate_24.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2a9,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_24);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_25.absolute = 2.2250738585072014e-308;
  predicate_25.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2aa,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4002000000000000,predicate_25);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_26.absolute = 2.2250738585072014e-308;
  predicate_26.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","3.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ab,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x400c000000000000,predicate_26);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_27.absolute = 2.2250738585072014e-308;
  predicate_27.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","4.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ac,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4013000000000000,predicate_27);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_28.absolute = 2.2250738585072014e-308;
  predicate_28.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ad,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4018000000000000,predicate_28);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,7.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_29.absolute = 2.2250738585072014e-308;
  predicate_29.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b0,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_29);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_30.absolute = 2.2250738585072014e-308;
  predicate_30.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b1,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4004000000000000,predicate_30);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_31.absolute = 2.2250738585072014e-308;
  predicate_31.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b2,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4010000000000000,predicate_31);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_32.absolute = 2.2250738585072014e-308;
  predicate_32.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","5.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b3,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4016000000000000,predicate_32);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_33.absolute = 2.2250738585072014e-308;
  predicate_33.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b4,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x401c000000000000,predicate_33);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,8.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_34.absolute = 2.2250738585072014e-308;
  predicate_34.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b7,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_34);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_35.absolute = 2.2250738585072014e-308;
  predicate_35.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","2.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b8,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4006000000000000,predicate_35);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_36.absolute = 2.2250738585072014e-308;
  predicate_36.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","4.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2b9,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4012000000000000,predicate_36);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_37.absolute = 2.2250738585072014e-308;
  predicate_37.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","6.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ba,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4019000000000000,predicate_37);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_38.absolute = 2.2250738585072014e-308;
  predicate_38.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2bb,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4020000000000000,predicate_38);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,9.0);
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_39.absolute = 2.2250738585072014e-308;
  predicate_39.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2be,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_39);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_40.absolute = 2.2250738585072014e-308;
  predicate_40.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2bf,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_40);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_41.absolute = 2.2250738585072014e-308;
  predicate_41.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c0,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_41);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_42.absolute = 2.2250738585072014e-308;
  predicate_42.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c1,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x401c000000000000,predicate_42);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_43.absolute = 2.2250738585072014e-308;
  predicate_43.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c2,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4022000000000000,predicate_43);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,10.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_44.absolute = 2.2250738585072014e-308;
  predicate_44.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c7,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_44);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_45.absolute = 2.2250738585072014e-308;
  predicate_45.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c8,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_45);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_46.absolute = 2.2250738585072014e-308;
  predicate_46.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2c9,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_46);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_47.absolute = 2.2250738585072014e-308;
  predicate_47.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ca,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x401c000000000000,predicate_47);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_48.absolute = 2.2250738585072014e-308;
  predicate_48.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2cb,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4024000000000000,predicate_48);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,11.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_49.absolute = 2.2250738585072014e-308;
  predicate_49.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ce,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_49);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_50.absolute = 2.2250738585072014e-308;
  predicate_50.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2cf,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_50);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_51.absolute = 2.2250738585072014e-308;
  predicate_51.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d0,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_51);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_52.absolute = 2.2250738585072014e-308;
  predicate_52.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d1,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4020000000000000,predicate_52);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_53.absolute = 2.2250738585072014e-308;
  predicate_53.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d2,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4026000000000000,predicate_53);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,12.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_54.absolute = 2.2250738585072014e-308;
  predicate_54.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d5,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_54);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_55.absolute = 2.2250738585072014e-308;
  predicate_55.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d6,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_55);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_56.absolute = 2.2250738585072014e-308;
  predicate_56.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d7,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_56);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_57.absolute = 2.2250738585072014e-308;
  predicate_57.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d8,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4022000000000000,predicate_57);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_58.absolute = 2.2250738585072014e-308;
  predicate_58.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","12.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2d9,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4028000000000000,predicate_58);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,13.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_59.absolute = 2.2250738585072014e-308;
  predicate_59.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2dc,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_59);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_60.absolute = 2.2250738585072014e-308;
  predicate_60.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2dd,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_60);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_61.absolute = 2.2250738585072014e-308;
  predicate_61.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2de,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4018000000000000,predicate_61);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_62.absolute = 2.2250738585072014e-308;
  predicate_62.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2df,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4024000000000000,predicate_62);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_63.absolute = 2.2250738585072014e-308;
  predicate_63.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","13.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e0,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402a000000000000,predicate_63);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,14.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_64.absolute = 2.2250738585072014e-308;
  predicate_64.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e3,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_64);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_65.absolute = 2.2250738585072014e-308;
  predicate_65.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e4,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4008000000000000,predicate_65);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_66.absolute = 2.2250738585072014e-308;
  predicate_66.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e5,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x401c000000000000,predicate_66);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_67.absolute = 2.2250738585072014e-308;
  predicate_67.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e6,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4026000000000000,predicate_67);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_68.absolute = 2.2250738585072014e-308;
  predicate_68.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","14.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2e7,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402c000000000000,predicate_68);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,15.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_69.absolute = 2.2250738585072014e-308;
  predicate_69.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ea,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_69);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_70.absolute = 2.2250738585072014e-308;
  predicate_70.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2eb,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4010000000000000,predicate_70);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_71.absolute = 2.2250738585072014e-308;
  predicate_71.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ec,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4020000000000000,predicate_71);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_72.absolute = 2.2250738585072014e-308;
  predicate_72.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","12.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ed,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4028000000000000,predicate_72);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_73.absolute = 2.2250738585072014e-308;
  predicate_73.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","15.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ee,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402e000000000000,predicate_73);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,16.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_74.absolute = 2.2250738585072014e-308;
  predicate_74.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f1,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_74);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_75.absolute = 2.2250738585072014e-308;
  predicate_75.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f2,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_75);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_76.absolute = 2.2250738585072014e-308;
  predicate_76.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f3,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4022000000000000,predicate_76);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_77.absolute = 2.2250738585072014e-308;
  predicate_77.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","13.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f4,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402a000000000000,predicate_77);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_78.absolute = 2.2250738585072014e-308;
  predicate_78.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","16.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f5,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4030000000000000,predicate_78);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,17.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_79.absolute = 2.2250738585072014e-308;
  predicate_79.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f8,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_79);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_80.absolute = 2.2250738585072014e-308;
  predicate_80.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2f9,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_80);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_81.absolute = 2.2250738585072014e-308;
  predicate_81.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2fa,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4022000000000000,predicate_81);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_82.absolute = 2.2250738585072014e-308;
  predicate_82.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","13.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2fb,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402a000000000000,predicate_82);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_83.absolute = 2.2250738585072014e-308;
  predicate_83.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","17.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2fc,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4031000000000000,predicate_83);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,18.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_84.absolute = 2.2250738585072014e-308;
  predicate_84.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x2ff,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_84);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_85.absolute = 2.2250738585072014e-308;
  predicate_85.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x300,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4018000000000000,predicate_85);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_86.absolute = 2.2250738585072014e-308;
  predicate_86.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x301,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4024000000000000,predicate_86);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_87.absolute = 2.2250738585072014e-308;
  predicate_87.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","14.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x302,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402c000000000000,predicate_87);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_88.absolute = 2.2250738585072014e-308;
  predicate_88.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","18.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x303,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4032000000000000,predicate_88);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,19.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_89.absolute = 2.2250738585072014e-308;
  predicate_89.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x306,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_89);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_90.absolute = 2.2250738585072014e-308;
  predicate_90.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x307,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4014000000000000,predicate_90);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_91.absolute = 2.2250738585072014e-308;
  predicate_91.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x308,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4024000000000000,predicate_91);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_92.absolute = 2.2250738585072014e-308;
  predicate_92.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","15.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x309,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x402e000000000000,predicate_92);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_93.absolute = 2.2250738585072014e-308;
  predicate_93.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","19.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30a,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4033000000000000,predicate_93);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,20.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_94.absolute = 2.2250738585072014e-308;
  predicate_94.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30d,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_94);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_95.absolute = 2.2250738585072014e-308;
  predicate_95.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30e,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4018000000000000,predicate_95);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_96.absolute = 2.2250738585072014e-308;
  predicate_96.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x30f,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4026000000000000,predicate_96);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_97.absolute = 2.2250738585072014e-308;
  predicate_97.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","16.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x310,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4030000000000000,predicate_97);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_98.absolute = 2.2250738585072014e-308;
  predicate_98.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","20.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x311,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4034000000000000,predicate_98);
  trial::online::quantile::
  psquare<double,_std::ratio<1L,_4L>,_std::ratio<1L,_2L>,_std::ratio<3L,_4L>_>::push(&quantile,21.0)
  ;
  local_160 = quantile.heights._M_elems[0];
  if (((quantile.count < 10) && (quantile.count < 2)) && (quantile.count == 0)) {
    local_160 = 0.0;
  }
  predicate_99.absolute = 2.2250738585072014e-308;
  predicate_99.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::minimum_ratio>()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x314,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x3ff0000000000000,predicate_99);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<1ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_x00100.absolute = 2.2250738585072014e-308;
  predicate_x00100.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::lower_quartile_ratio>()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x315,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4018000000000000,predicate_x00100);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<2ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_x00101.absolute = 2.2250738585072014e-308;
  predicate_x00101.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::median_ratio>()","11.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x316,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4026000000000000,predicate_x00101);
  local_160 = trial::online::quantile::
              psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>>::get<3ul>
                        ((psquare<double,std::ratio<1l,4l>,std::ratio<1l,2l>,std::ratio<3l,4l>> *)
                         &quantile);
  predicate_x00102.absolute = 2.2250738585072014e-308;
  predicate_x00102.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::upper_quartile_ratio>()","16.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x317,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4030000000000000,predicate_x00102);
  local_160 = quantile.heights._M_elems[8];
  if (quantile.count < 10) {
    if (quantile.count < 2) {
      local_160 = quantile.heights._M_elems[0];
      if (quantile.count == 0) {
        local_160 = 0.0;
      }
    }
    else {
      local_160 = (double)quantile.positions._M_elems[quantile.count + 8];
    }
  }
  predicate_x00103.absolute = 2.2250738585072014e-308;
  predicate_x00103.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"quantile.value<quantile::maximum_ratio>()","21.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/quantile/psquare_suite.cpp"
             ,(char *)0x318,0x1146c0,(char *)&local_160,(double *)&stack0xfffffffffffffe98,
             (double *)0x4035000000000000,predicate_x00103);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    quantile::psquare_quartile<double> quantile;

    quantile.push(1);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 1.0, tolerance);

    quantile.push(2);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 1.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 1.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 2.0, tolerance);

    quantile.push(3);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 2.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 2.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 3.0, tolerance);

    quantile.push(4);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 1.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 2.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 3.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 4.0, tolerance);

    quantile.push(5);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 3.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 4.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 5.0, tolerance);

    quantile.push(6);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 3.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 4.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 6.0, tolerance);

    quantile.push(7);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 4.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 5.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 7.0, tolerance);

    quantile.push(8);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 2.75, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 4.5, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 6.25, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 8.0, tolerance);

    quantile.push(9);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 7.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 9.0, tolerance);

    // Switch to approximation

    quantile.push(10);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance);
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 3.25
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance); // 5.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 7.0, tolerance); // 7.75
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 10.0, tolerance);

    quantile.push(11);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 3.5
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance); // 6.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 8.0, tolerance); // 8.5
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 11.0, tolerance); // 11.0

    quantile.push(12);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 3.75
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 5.0, tolerance); // 6.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 9.0, tolerance); // 9.25
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 12.0, tolerance); // 12.0

    quantile.push(13);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 4.0
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 6.0, tolerance); // 7.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 10.0, tolerance); // 10.0
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 13.0, tolerance); // 13.0

    quantile.push(14);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 3.0, tolerance); // 4.25
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 7.0, tolerance); // 7.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 11.0, tolerance); // 10.75
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 14.0, tolerance); // 14.0

    quantile.push(15);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 4.0, tolerance); // 4.5
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 8.0, tolerance); // 8.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 12.0, tolerance); // 11.5
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 15.0, tolerance); // 15.0

    quantile.push(16);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 5.0, tolerance); // 4.75
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 9.0, tolerance); // 8.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 13.0, tolerance); // 12.25
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 16.0, tolerance); // 16.0

    quantile.push(17);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 5.0, tolerance); // 5.0
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 9.0, tolerance); // 9.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 13.0, tolerance); // 13.0
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 17.0, tolerance); // 17.0

    quantile.push(18);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 6.0, tolerance); // 5.25
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 10.0, tolerance); // 9.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 14.0, tolerance); // 13.75
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 18.0, tolerance); // 18.0

    quantile.push(19);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 5.0, tolerance); // 5.5
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 10.0, tolerance); // 10.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 15.0, tolerance); // 14.5
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 19.0, tolerance); // 19.0

    quantile.push(20);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 6.0, tolerance); // 5.75
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 11.0, tolerance); // 10.5
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 16.0, tolerance); // 15.25
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 20.0, tolerance); // 20.0

    quantile.push(21);
    TRIAL_TEST_WITH(quantile.value<quantile::minimum_ratio>(), 1.0, tolerance); // 1.0
    TRIAL_TEST_WITH(quantile.value<quantile::lower_quartile_ratio>(), 6.0, tolerance); // 6.0
    TRIAL_TEST_WITH(quantile.value<quantile::median_ratio>(), 11.0, tolerance); // 11.0
    TRIAL_TEST_WITH(quantile.value<quantile::upper_quartile_ratio>(), 16.0, tolerance); // 16.0
    TRIAL_TEST_WITH(quantile.value<quantile::maximum_ratio>(), 21.0, tolerance); // 21.0
}